

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)77,(moira::Mode)10,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  undefined2 in_CX;
  StrWriter *in_RSI;
  Ea<(moira::Mode)10,_(moira::Size)4> *in_RDI;
  Ea<(moira::Mode)10,_(moira::Size)4> src;
  RegRegList dst;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  Align align;
  undefined4 in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  RegRegList in_stack_ffffffffffffffd6;
  u16 in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  RegRegList in_stack_ffffffffffffffe4;
  
  uVar1 = dasmRead<(moira::Size)2>
                    ((Moira *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                     &in_RDI->pc);
  RegRegList::RegRegList((RegRegList *)&stack0xffffffffffffffe4,(u16)uVar1);
  Op<(moira::Mode)10,(moira::Size)4>
            ((Moira *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4.raw,
                                              in_stack_ffffffffffffffe0)),in_stack_ffffffffffffffde,
             (u32 *)CONCAT26(in_stack_ffffffffffffffd6.raw,in_stack_ffffffffffffffd0));
  pSVar2 = StrWriter::operator<<(in_RSI);
  pSVar2 = StrWriter::operator<<(pSVar2);
  align.raw = in_RDI[1].pc;
  StrWriter::operator<<(pSVar2,align);
  pSVar2 = StrWriter::operator<<
                     ((StrWriter *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                      in_RDI);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(in_stack_ffffffffffffffcc,align.raw),in_stack_ffffffffffffffd6);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = RegRegList ( dasmRead<Word>(addr)       );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}